

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

Utility_Test_Numbers __thiscall
chaiscript::ChaiScript_Basic::eval<Utility_Test_Numbers>
          (ChaiScript_Basic *this,string *t_input,Exception_Handler *t_handler,string *t_filename)

{
  Utility_Test_Numbers UVar1;
  undefined1 local_20 [16];
  
  eval((ChaiScript_Basic *)local_20,(string *)this,(Exception_Handler *)t_input,(string *)t_handler)
  ;
  UVar1 = detail::Dispatch_Engine::boxed_cast<Utility_Test_Numbers>
                    (&this->m_engine,(Boxed_Value *)local_20);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_20 + 8));
  return UVar1;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename = "__EVAL__") {
      return m_engine.boxed_cast<T>(eval(t_input, t_handler, t_filename));
    }